

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O3

int csp_id_setup_rx(csp_packet_t *packet)

{
  bool bVar1;
  
  bVar1 = csp_conf.version == '\x02';
  (packet->field_0).field_1.frame_begin = packet->header + (ulong)!bVar1 * 2 + 2;
  (packet->field_0).field_1.frame_length = 0;
  return (uint)bVar1 * 2 + 4;
}

Assistant:

int csp_id_setup_rx(csp_packet_t * packet) {
	if (csp_conf.version == 2) {
		csp_id2_setup_rx(packet);
		return CSP_ID2_HEADER_SIZE;
	} else {
		csp_id1_setup_rx(packet);
		return CSP_ID1_HEADER_SIZE;
	}
}